

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_path.cpp
# Opt level: O0

vector<Item_*,_std::allocator<Item_*>_> * __thiscall
WorldPath::missing_items_to_cross
          (vector<Item_*,_std::allocator<Item_*>_> *__return_storage_ptr__,WorldPath *this,
          vector<Item_*,_std::allocator<Item_*>_> *player_inventory_copy,
          bool only_strictly_required_items)

{
  bool bVar1;
  reference ppIVar2;
  const_iterator local_b8;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_b0;
  Item **local_a8;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_a0;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> local_98;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> iter;
  Item *item_1;
  iterator __end1;
  iterator __begin1;
  vector<Item_*,_std::allocator<Item_*>_> *__range1;
  Item *local_60;
  Item *item;
  iterator __end2;
  iterator __begin2;
  vector<Item_*,_std::allocator<Item_*>_> *__range2;
  vector<Item_*,_std::allocator<Item_*>_> items_to_test;
  bool only_strictly_required_items_local;
  vector<Item_*,_std::allocator<Item_*>_> *player_inventory_copy_local;
  WorldPath *this_local;
  vector<Item_*,_std::allocator<Item_*>_> *missing_items;
  
  items_to_test.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = only_strictly_required_items;
  std::vector<Item_*,_std::allocator<Item_*>_>::vector
            ((vector<Item_*,_std::allocator<Item_*>_> *)&__range2,&this->_required_items);
  if ((items_to_test.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    __end2 = std::vector<Item_*,_std::allocator<Item_*>_>::begin(&this->_items_placed_when_crossing)
    ;
    item = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end
                             (&this->_items_placed_when_crossing);
    while (bVar1 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                             (&__end2,(__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                       *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppIVar2 = __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                ::operator*(&__end2);
      local_60 = *ppIVar2;
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                ((vector<Item*,std::allocator<Item*>> *)&__range2,&local_60);
      __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
      operator++(&__end2);
    }
  }
  std::vector<Item_*,_std::allocator<Item_*>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<Item_*,_std::allocator<Item_*>_>::begin
                     ((vector<Item_*,_std::allocator<Item_*>_> *)&__range2);
  item_1 = (Item *)std::vector<Item_*,_std::allocator<Item_*>_>::end
                             ((vector<Item_*,_std::allocator<Item_*>_> *)&__range2);
  while (bVar1 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                           (&__end1,(__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                     *)&item_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar2 = __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::
              operator*(&__end1);
    iter._M_current = (Item **)*ppIVar2;
    local_a0._M_current =
         (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::begin(player_inventory_copy);
    local_a8 = (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::end(player_inventory_copy);
    local_98 = std::
               find<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,Item*>
                         (local_a0,(__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                                    )local_a8,(Item **)&iter);
    local_b0._M_current =
         (Item **)std::vector<Item_*,_std::allocator<Item_*>_>::end(player_inventory_copy);
    bVar1 = __gnu_cxx::operator==<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>
                      (&local_98,&local_b0);
    if (bVar1) {
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                ((vector<Item*,std::allocator<Item*>> *)__return_storage_ptr__,(Item **)&iter);
    }
    else {
      __gnu_cxx::__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>>::
      __normal_iterator<Item**>
                ((__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>> *)
                 &local_b8,&local_98);
      std::vector<Item_*,_std::allocator<Item_*>_>::erase(player_inventory_copy,local_b8);
    }
    __gnu_cxx::__normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_>::operator++
              (&__end1);
  }
  std::vector<Item_*,_std::allocator<Item_*>_>::~vector
            ((vector<Item_*,_std::allocator<Item_*>_> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Item*> WorldPath::missing_items_to_cross(std::vector<Item*> player_inventory_copy, bool only_strictly_required_items)
{
    std::vector<Item*> items_to_test = _required_items;
    if(!only_strictly_required_items)
    {
        for(Item* item : _items_placed_when_crossing)
            items_to_test.emplace_back(item);
    }

    std::vector<Item*> missing_items;
    for (Item* item : items_to_test)
    {
        auto iter = std::find(player_inventory_copy.begin(), player_inventory_copy.end(), item);
        if (iter == player_inventory_copy.end())
        {
            missing_items.emplace_back(item);
        }
        else
        {
            // If item has been found, remove it from the inventory copy for it not to count several times
            // (case where quantity needed is > 1)
            player_inventory_copy.erase(iter);
        }
    }

    return missing_items;
}